

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O1

void __thiscall cfd::Psbt::SetUtxoData(Psbt *this,UtxoData *utxo,Transaction *transaction)

{
  uint32_t uVar1;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> key_list;
  OutPoint outpoint;
  Script redeem_script;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> local_98;
  OutPoint local_78;
  Script local_50;
  
  cfd::core::OutPoint::OutPoint(&local_78);
  local_98.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::core::Script::Script(&local_50);
  ConvertFromUtxoData(utxo,&local_78,(TxOut *)0x0,&local_98,&local_50,true,(NetType *)0x0);
  uVar1 = GetTxInIndex(this,&local_78);
  cfd::core::Psbt::SetTxInUtxo
            ((uint)this,(Transaction *)(ulong)uVar1,(Script *)transaction,(vector *)&local_50);
  core::Script::~Script(&local_50);
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector(&local_98);
  local_78.txid_._vptr_Txid = (_func_int **)&PTR__Txid_002b2f00;
  if (local_78.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.txid_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Psbt::SetUtxoData(const UtxoData& utxo, const Transaction& transaction) {
  OutPoint outpoint;
  std::vector<KeyData> key_list;
  Script redeem_script;
  ConvertFromUtxoData(
      utxo, &outpoint, nullptr, &key_list, &redeem_script, true);

  SetTxInUtxo(outpoint, transaction, redeem_script, key_list);
}